

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatbuffers.h
# Opt level: O0

Offset<flatbuffers::Vector<unsigned_char>_> __thiscall
flatbuffers::FlatBufferBuilder::CreateVector<unsigned_char>
          (FlatBufferBuilder *this,uchar *v,size_t len)

{
  uoffset_t _o;
  size_t local_30;
  size_t i;
  size_t len_local;
  uchar *v_local;
  FlatBufferBuilder *this_local;
  
  NotNested(this);
  StartVector(this,len,1);
  local_30 = len;
  while (local_30 != 0) {
    PushElement<unsigned_char>(this,v[local_30 - 1]);
    local_30 = local_30 - 1;
  }
  _o = EndVector(this,len);
  Offset<flatbuffers::Vector<unsigned_char>_>::Offset
            ((Offset<flatbuffers::Vector<unsigned_char>_> *)((long)&this_local + 4),_o);
  return (Offset<flatbuffers::Vector<unsigned_char>_>)this_local._4_4_;
}

Assistant:

Offset<Vector<T>> CreateVector(const T *v, size_t len) {
    NotNested();
    StartVector(len, sizeof(T));
    for (auto i = len; i > 0; ) {
      PushElement(v[--i]);
    }
    return Offset<Vector<T>>(EndVector(len));
  }